

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# List.h
# Opt level: O0

void __thiscall
Js::
CopyRemovePolicy<JsUtil::List<JsUtil::Pair<unsigned_int,_IR::LabelInstr_*,_DefaultComparer>,_Memory::JitArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>,_true>
::Remove(CopyRemovePolicy<JsUtil::List<JsUtil::Pair<unsigned_int,_IR::LabelInstr_*,_DefaultComparer>,_Memory::JitArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>,_true>
         *this,List<JsUtil::Pair<unsigned_int,_IR::LabelInstr_*,_DefaultComparer>,_Memory::JitArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
               *list,TElementType *item)

{
  Type pPVar1;
  undefined4 uVar2;
  bool bVar3;
  Type *pTVar4;
  Type pPVar5;
  Type pPVar6;
  int local_38;
  int local_34;
  int j;
  int i;
  int *count;
  TElementType *buffer;
  TElementType *item_local;
  List<JsUtil::Pair<unsigned_int,_IR::LabelInstr_*,_DefaultComparer>,_Memory::JitArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *list_local;
  CopyRemovePolicy<JsUtil::List<JsUtil::Pair<unsigned_int,_IR::LabelInstr_*,_DefaultComparer>,_Memory::JitArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>,_true>
  *this_local;
  
  pPVar1 = (list->
           super_ReadOnlyList<JsUtil::Pair<unsigned_int,_IR::LabelInstr_*,_DefaultComparer>,_Memory::JitArenaAllocator,_DefaultComparer>
           ).buffer;
  pTVar4 = &(list->
            super_ReadOnlyList<JsUtil::Pair<unsigned_int,_IR::LabelInstr_*,_DefaultComparer>,_Memory::JitArenaAllocator,_DefaultComparer>
            ).count;
  local_34 = 0;
  while( true ) {
    if (*pTVar4 <= local_34) {
      return;
    }
    bVar3 = DefaultComparer<JsUtil::Pair<unsigned_int,_IR::LabelInstr_*,_DefaultComparer>_>::Equals
                      (pPVar1 + local_34,item);
    local_38 = local_34;
    if (bVar3) break;
    local_34 = local_34 + 1;
  }
  while (local_38 = local_38 + 1, local_38 < *pTVar4) {
    pPVar6 = pPVar1 + local_38;
    pPVar5 = pPVar1 + local_34;
    uVar2 = *(undefined4 *)&pPVar6->field_0x4;
    pPVar5->first = pPVar6->first;
    *(undefined4 *)&pPVar5->field_0x4 = uVar2;
    pPVar5->second = pPVar6->second;
    pPVar5->initialized = pPVar6->initialized;
    local_34 = local_34 + 1;
  }
  *pTVar4 = *pTVar4 + -1;
  Memory::ClearArray<JsUtil::Pair<unsigned_int,IR::LabelInstr*,DefaultComparer>>(pPVar1 + *pTVar4,1)
  ;
  return;
}

Assistant:

void Remove(TListType* list, const TElementType& item)
        {
            TElementType* buffer = list->buffer;
            int& count = list->count;

            for (int i = 0; i < count; i++)
            {
                if (TComparerType::Equals(buffer[i], item))
                {
                    for (int j = i + 1; j < count; i++, j++)
                    {
                        buffer[i] = buffer[j];
                    }
                    count--;

                    if (clearOldEntries)
                    {
                        ClearArray(buffer + count, 1);
                    }
                    break;
                }
            }
        }